

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O2

void __thiscall serial::IOException::~IOException(IOException *this)

{
  ~IOException(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual ~IOException() throw() {}